

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

SDL12Key Scancode20toKeysym12(SDL_Scancode scancode20)

{
  SDL12Key local_c;
  SDL_Scancode scancode20_local;
  
  switch(scancode20) {
  case SDL_SCANCODE_A:
    local_c = SDLK12_a;
    break;
  case SDL_SCANCODE_B:
    local_c = SDLK12_b;
    break;
  case SDL_SCANCODE_C:
    local_c = SDLK12_c;
    break;
  case SDL_SCANCODE_D:
    local_c = SDLK12_d;
    break;
  case SDL_SCANCODE_E:
    local_c = SDLK12_e;
    break;
  case SDL_SCANCODE_F:
    local_c = SDLK12_f;
    break;
  case SDL_SCANCODE_G:
    local_c = SDLK12_g;
    break;
  case SDL_SCANCODE_H:
    local_c = SDLK12_h;
    break;
  case SDL_SCANCODE_I:
    local_c = SDLK12_i;
    break;
  case SDL_SCANCODE_J:
    local_c = SDLK12_j;
    break;
  case SDL_SCANCODE_K:
    local_c = SDLK12_k;
    break;
  case SDL_SCANCODE_L:
    local_c = SDLK12_l;
    break;
  case SDL_SCANCODE_M:
    local_c = SDLK12_m;
    break;
  case SDL_SCANCODE_N:
    local_c = SDLK12_n;
    break;
  case SDL_SCANCODE_O:
    local_c = SDLK12_o;
    break;
  case SDL_SCANCODE_P:
    local_c = SDLK12_p;
    break;
  case SDL_SCANCODE_Q:
    local_c = SDLK12_q;
    break;
  case SDL_SCANCODE_R:
    local_c = SDLK12_r;
    break;
  case SDL_SCANCODE_S:
    local_c = SDLK12_s;
    break;
  case SDL_SCANCODE_T:
    local_c = SDLK12_t;
    break;
  case SDL_SCANCODE_U:
    local_c = SDLK12_u;
    break;
  case SDL_SCANCODE_V:
    local_c = SDLK12_v;
    break;
  case SDL_SCANCODE_W:
    local_c = SDLK12_w;
    break;
  case SDL_SCANCODE_X:
    local_c = SDLK12_x;
    break;
  case SDL_SCANCODE_Y:
    local_c = SDLK12_y;
    break;
  case SDL_SCANCODE_Z:
    local_c = SDLK12_z;
    break;
  case SDL_SCANCODE_1:
    local_c = SDLK12_1;
    break;
  case SDL_SCANCODE_2:
    local_c = SDLK12_2;
    break;
  case SDL_SCANCODE_3:
    local_c = SDLK12_3;
    break;
  case SDL_SCANCODE_4:
    local_c = SDLK12_4;
    break;
  case SDL_SCANCODE_5:
    local_c = SDLK12_5;
    break;
  case SDL_SCANCODE_6:
    local_c = SDLK12_6;
    break;
  case SDL_SCANCODE_7:
    local_c = SDLK12_7;
    break;
  case SDL_SCANCODE_8:
    local_c = SDLK12_8;
    break;
  case SDL_SCANCODE_9:
    local_c = SDLK12_9;
    break;
  case SDL_SCANCODE_0:
    local_c = SDLK12_0;
    break;
  case SDL_SCANCODE_RETURN:
    local_c = SDLK12_RETURN;
    break;
  case SDL_SCANCODE_ESCAPE:
    local_c = SDLK12_ESCAPE;
    break;
  case SDL_SCANCODE_BACKSPACE:
    local_c = SDLK12_BACKSPACE;
    break;
  case SDL_SCANCODE_TAB:
    local_c = SDLK12_TAB;
    break;
  case SDL_SCANCODE_SPACE:
    local_c = SDLK12_SPACE;
    break;
  case SDL_SCANCODE_MINUS:
    local_c = SDLK12_MINUS;
    break;
  case SDL_SCANCODE_EQUALS:
    local_c = SDLK12_EQUALS;
    break;
  case SDL_SCANCODE_LEFTBRACKET:
    local_c = SDLK12_LEFTBRACKET;
    break;
  case SDL_SCANCODE_RIGHTBRACKET:
    local_c = SDLK12_RIGHTBRACKET;
    break;
  case SDL_SCANCODE_BACKSLASH:
    local_c = SDLK12_BACKSLASH;
    break;
  case SDL_SCANCODE_NONUSHASH:
    local_c = SDLK12_HASH;
    break;
  case SDL_SCANCODE_SEMICOLON:
    local_c = SDLK12_SEMICOLON;
    break;
  case SDL_SCANCODE_APOSTROPHE:
    local_c = SDLK12_QUOTE;
    break;
  case SDL_SCANCODE_GRAVE:
    local_c = SDLK12_BACKQUOTE;
    break;
  case SDL_SCANCODE_COMMA:
    local_c = SDLK12_COMMA;
    break;
  case SDL_SCANCODE_PERIOD:
    local_c = SDLK12_PERIOD;
    break;
  case SDL_SCANCODE_SLASH:
    local_c = SDLK12_SLASH;
    break;
  case SDL_SCANCODE_CAPSLOCK:
    local_c = SDLK12_CAPSLOCK;
    break;
  case SDL_SCANCODE_F1:
    local_c = SDLK12_F1;
    break;
  case SDL_SCANCODE_F2:
    local_c = SDLK12_F2;
    break;
  case SDL_SCANCODE_F3:
    local_c = SDLK12_F3;
    break;
  case SDL_SCANCODE_F4:
    local_c = SDLK12_F4;
    break;
  case SDL_SCANCODE_F5:
    local_c = SDLK12_F5;
    break;
  case SDL_SCANCODE_F6:
    local_c = SDLK12_F6;
    break;
  case SDL_SCANCODE_F7:
    local_c = SDLK12_F7;
    break;
  case SDL_SCANCODE_F8:
    local_c = SDLK12_F8;
    break;
  case SDL_SCANCODE_F9:
    local_c = SDLK12_F9;
    break;
  case SDL_SCANCODE_F10:
    local_c = SDLK12_F10;
    break;
  case SDL_SCANCODE_F11:
    local_c = SDLK12_F11;
    break;
  case SDL_SCANCODE_F12:
    local_c = SDLK12_F12;
    break;
  case SDL_SCANCODE_PRINTSCREEN:
    local_c = SDLK12_PRINT;
    break;
  case SDL_SCANCODE_SCROLLLOCK:
    local_c = SDLK12_SCROLLOCK;
    break;
  case SDL_SCANCODE_PAUSE:
    local_c = SDLK12_PAUSE;
    break;
  case SDL_SCANCODE_INSERT:
    local_c = SDLK12_INSERT;
    break;
  case SDL_SCANCODE_HOME:
    local_c = SDLK12_HOME;
    break;
  case SDL_SCANCODE_PAGEUP:
    local_c = SDLK12_PAGEUP;
    break;
  case SDL_SCANCODE_DELETE:
    local_c = SDLK12_DELETE;
    break;
  case SDL_SCANCODE_END:
    local_c = SDLK12_END;
    break;
  case SDL_SCANCODE_PAGEDOWN:
    local_c = SDLK12_PAGEDOWN;
    break;
  case SDL_SCANCODE_RIGHT:
    local_c = SDLK12_RIGHT;
    break;
  case SDL_SCANCODE_LEFT:
    local_c = SDLK12_LEFT;
    break;
  case SDL_SCANCODE_DOWN:
    local_c = SDLK12_DOWN;
    break;
  case SDL_SCANCODE_UP:
    local_c = SDLK12_UP;
    break;
  case SDL_SCANCODE_NUMLOCKCLEAR:
    local_c = SDLK12_NUMLOCK;
    break;
  case SDL_SCANCODE_KP_DIVIDE:
    local_c = SDLK12_KP_DIVIDE;
    break;
  case SDL_SCANCODE_KP_MULTIPLY:
    local_c = SDLK12_KP_MULTIPLY;
    break;
  case SDL_SCANCODE_KP_MINUS:
    local_c = SDLK12_KP_MINUS;
    break;
  case SDL_SCANCODE_KP_PLUS:
    local_c = SDLK12_KP_PLUS;
    break;
  case SDL_SCANCODE_KP_ENTER:
    local_c = SDLK12_KP_ENTER;
    break;
  case SDL_SCANCODE_KP_1:
    local_c = SDLK12_KP1;
    break;
  case SDL_SCANCODE_KP_2:
    local_c = SDLK12_KP2;
    break;
  case SDL_SCANCODE_KP_3:
    local_c = SDLK12_KP3;
    break;
  case SDL_SCANCODE_KP_4:
    local_c = SDLK12_KP4;
    break;
  case SDL_SCANCODE_KP_5:
    local_c = SDLK12_KP5;
    break;
  case SDL_SCANCODE_KP_6:
    local_c = SDLK12_KP6;
    break;
  case SDL_SCANCODE_KP_7:
    local_c = SDLK12_KP7;
    break;
  case SDL_SCANCODE_KP_8:
    local_c = SDLK12_KP8;
    break;
  case SDL_SCANCODE_KP_9:
    local_c = SDLK12_KP9;
    break;
  case SDL_SCANCODE_KP_0:
    local_c = SDLK12_KP0;
    break;
  default:
    local_c = SDLK12_FIRST;
    break;
  case SDL_SCANCODE_NONUSBACKSLASH:
    local_c = SDLK12_BACKSLASH;
    break;
  case SDL_SCANCODE_APPLICATION:
    local_c = SDLK12_MENU;
    break;
  case SDL_SCANCODE_POWER:
    local_c = SDLK12_POWER;
    break;
  case SDL_SCANCODE_KP_EQUALS:
    local_c = SDLK12_KP_EQUALS;
    break;
  case SDL_SCANCODE_F13:
    local_c = SDLK12_F13;
    break;
  case SDL_SCANCODE_F14:
    local_c = SDLK12_F14;
    break;
  case SDL_SCANCODE_F15:
    local_c = SDLK12_F15;
    break;
  case SDL_SCANCODE_HELP:
    local_c = SDLK12_HELP;
    break;
  case SDL_SCANCODE_MENU:
    local_c = SDLK12_MENU;
    break;
  case SDL_SCANCODE_SYSREQ:
    local_c = SDLK12_SYSREQ;
    break;
  case SDL_SCANCODE_CLEAR:
    local_c = SDLK12_CLEAR;
    break;
  case SDL_SCANCODE_LCTRL:
    local_c = SDLK12_LCTRL;
    break;
  case SDL_SCANCODE_LSHIFT:
    local_c = SDLK12_LSHIFT;
    break;
  case SDL_SCANCODE_LALT:
    local_c = SDLK12_LALT;
    break;
  case SDL_SCANCODE_LGUI:
    local_c = SDLK12_LSUPER;
    break;
  case SDL_SCANCODE_RCTRL:
    local_c = SDLK12_RCTRL;
    break;
  case SDL_SCANCODE_RSHIFT:
    local_c = SDLK12_RSHIFT;
    break;
  case SDL_SCANCODE_RALT:
    local_c = SDLK12_RALT;
    break;
  case SDL_SCANCODE_RGUI:
    local_c = SDLK12_RSUPER;
    break;
  case SDL_SCANCODE_MODE:
    local_c = SDLK12_MODE;
  }
  return local_c;
}

Assistant:

static SDL12Key
Scancode20toKeysym12(const SDL_Scancode scancode20)
{
    switch (scancode20) {
    #define CASESCANCODE20TOKEY12(s20, k12) case SDL_SCANCODE_##s20: return SDLK12_##k12
    CASESCANCODE20TOKEY12(A,a);
    CASESCANCODE20TOKEY12(B,b);
    CASESCANCODE20TOKEY12(C,c);
    CASESCANCODE20TOKEY12(D,d);
    CASESCANCODE20TOKEY12(E,e);
    CASESCANCODE20TOKEY12(F,f);
    CASESCANCODE20TOKEY12(G,g);
    CASESCANCODE20TOKEY12(H,h);
    CASESCANCODE20TOKEY12(I,i);
    CASESCANCODE20TOKEY12(J,j);
    CASESCANCODE20TOKEY12(K,k);
    CASESCANCODE20TOKEY12(L,l);
    CASESCANCODE20TOKEY12(M,m);
    CASESCANCODE20TOKEY12(N,n);
    CASESCANCODE20TOKEY12(O,o);
    CASESCANCODE20TOKEY12(P,p);
    CASESCANCODE20TOKEY12(Q,q);
    CASESCANCODE20TOKEY12(R,r);
    CASESCANCODE20TOKEY12(S,s);
    CASESCANCODE20TOKEY12(T,t);
    CASESCANCODE20TOKEY12(U,u);
    CASESCANCODE20TOKEY12(V,v);
    CASESCANCODE20TOKEY12(W,w);
    CASESCANCODE20TOKEY12(X,x);
    CASESCANCODE20TOKEY12(Y,y);
    CASESCANCODE20TOKEY12(Z,z);
    CASESCANCODE20TOKEY12(1,1);
    CASESCANCODE20TOKEY12(2,2);
    CASESCANCODE20TOKEY12(3,3);
    CASESCANCODE20TOKEY12(4,4);
    CASESCANCODE20TOKEY12(5,5);
    CASESCANCODE20TOKEY12(6,6);
    CASESCANCODE20TOKEY12(7,7);
    CASESCANCODE20TOKEY12(8,8);
    CASESCANCODE20TOKEY12(9,9);
    CASESCANCODE20TOKEY12(0,0);
    CASESCANCODE20TOKEY12(RETURN,RETURN);
    CASESCANCODE20TOKEY12(ESCAPE,ESCAPE);
    CASESCANCODE20TOKEY12(BACKSPACE,BACKSPACE);
    CASESCANCODE20TOKEY12(TAB,TAB);
    CASESCANCODE20TOKEY12(SPACE,SPACE);
    CASESCANCODE20TOKEY12(MINUS,MINUS);
    CASESCANCODE20TOKEY12(EQUALS,EQUALS);
    CASESCANCODE20TOKEY12(LEFTBRACKET,LEFTBRACKET);
    CASESCANCODE20TOKEY12(RIGHTBRACKET,RIGHTBRACKET);
    CASESCANCODE20TOKEY12(BACKSLASH,BACKSLASH);
    CASESCANCODE20TOKEY12(NONUSHASH,HASH);
    CASESCANCODE20TOKEY12(SEMICOLON,SEMICOLON);
    CASESCANCODE20TOKEY12(APOSTROPHE,QUOTE);
    CASESCANCODE20TOKEY12(GRAVE,BACKQUOTE);
    CASESCANCODE20TOKEY12(COMMA,COMMA);
    CASESCANCODE20TOKEY12(PERIOD,PERIOD);
    CASESCANCODE20TOKEY12(SLASH,SLASH);
    CASESCANCODE20TOKEY12(CAPSLOCK,CAPSLOCK);
    CASESCANCODE20TOKEY12(F1,F1);
    CASESCANCODE20TOKEY12(F2,F2);
    CASESCANCODE20TOKEY12(F3,F3);
    CASESCANCODE20TOKEY12(F4,F4);
    CASESCANCODE20TOKEY12(F5,F5);
    CASESCANCODE20TOKEY12(F6,F6);
    CASESCANCODE20TOKEY12(F7,F7);
    CASESCANCODE20TOKEY12(F8,F8);
    CASESCANCODE20TOKEY12(F9,F9);
    CASESCANCODE20TOKEY12(F10,F10);
    CASESCANCODE20TOKEY12(F11,F11);
    CASESCANCODE20TOKEY12(F12,F12);
    CASESCANCODE20TOKEY12(PRINTSCREEN,PRINT);
    CASESCANCODE20TOKEY12(SCROLLLOCK,SCROLLOCK);
    CASESCANCODE20TOKEY12(PAUSE,PAUSE);
    CASESCANCODE20TOKEY12(INSERT,INSERT);
    CASESCANCODE20TOKEY12(HOME,HOME);
    CASESCANCODE20TOKEY12(PAGEUP,PAGEUP);
    CASESCANCODE20TOKEY12(DELETE,DELETE);
    CASESCANCODE20TOKEY12(END,END);
    CASESCANCODE20TOKEY12(PAGEDOWN,PAGEDOWN);
    CASESCANCODE20TOKEY12(RIGHT,RIGHT);
    CASESCANCODE20TOKEY12(LEFT,LEFT);
    CASESCANCODE20TOKEY12(DOWN,DOWN);
    CASESCANCODE20TOKEY12(UP,UP);
    CASESCANCODE20TOKEY12(NUMLOCKCLEAR,NUMLOCK);

    CASESCANCODE20TOKEY12(KP_DIVIDE,KP_DIVIDE);
    CASESCANCODE20TOKEY12(KP_MULTIPLY,KP_MULTIPLY);
    CASESCANCODE20TOKEY12(KP_MINUS,KP_MINUS);
    CASESCANCODE20TOKEY12(KP_PLUS,KP_PLUS);
    CASESCANCODE20TOKEY12(KP_ENTER,KP_ENTER);
    CASESCANCODE20TOKEY12(KP_1,KP1);
    CASESCANCODE20TOKEY12(KP_2,KP2);
    CASESCANCODE20TOKEY12(KP_3,KP3);
    CASESCANCODE20TOKEY12(KP_4,KP4);
    CASESCANCODE20TOKEY12(KP_5,KP5);
    CASESCANCODE20TOKEY12(KP_6,KP6);
    CASESCANCODE20TOKEY12(KP_7,KP7);
    CASESCANCODE20TOKEY12(KP_8,KP8);
    CASESCANCODE20TOKEY12(KP_9,KP9);
    CASESCANCODE20TOKEY12(KP_0,KP0);

    CASESCANCODE20TOKEY12(NONUSBACKSLASH,BACKSLASH);
    /* In theory, this could be MENU, or COMPOSE, or neither, but on my machine, it's MENU. */
    CASESCANCODE20TOKEY12(APPLICATION,MENU);
    CASESCANCODE20TOKEY12(POWER,POWER);
    CASESCANCODE20TOKEY12(F13,F13);
    CASESCANCODE20TOKEY12(F14,F14);
    CASESCANCODE20TOKEY12(F15,F15);
    CASESCANCODE20TOKEY12(KP_EQUALS,KP_EQUALS);
    /* SDL 1.2 doesn't support F16..F21 */
    /* Nor SDL_SCANCODE_EXECUTE */
    CASESCANCODE20TOKEY12(HELP,HELP);
    CASESCANCODE20TOKEY12(MENU,MENU);
    /* The next several scancodes don't have equivalents, until... */
    CASESCANCODE20TOKEY12(SYSREQ,SYSREQ);
    CASESCANCODE20TOKEY12(CLEAR,CLEAR);
    /* Skip some more... */
    CASESCANCODE20TOKEY12(LCTRL,LCTRL);
    CASESCANCODE20TOKEY12(LSHIFT,LSHIFT);
    CASESCANCODE20TOKEY12(LALT,LALT);
#ifdef __MACOSX__
    CASESCANCODE20TOKEY12(LGUI,LMETA);
#else
    CASESCANCODE20TOKEY12(LGUI,LSUPER);
#endif
    CASESCANCODE20TOKEY12(RCTRL,RCTRL);
    CASESCANCODE20TOKEY12(RSHIFT,RSHIFT);
    CASESCANCODE20TOKEY12(RALT,RALT);
#ifdef __MACOSX__
    CASESCANCODE20TOKEY12(RGUI,RMETA);
#else
    CASESCANCODE20TOKEY12(RGUI,RSUPER);
#endif

    CASESCANCODE20TOKEY12(MODE,MODE);
    #undef CASESCANCODE20TOKEY12
    default: break;
    }

    return SDLK12_UNKNOWN;
}